

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  *local_470;
  exception *e;
  anon_class_8_1_c4023006 local_408;
  function<void_(bool,_bool)> local_400;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  local_3db;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3da;
  undefined1 local_3d9;
  anon_class_8_1_6d10d30c local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  anon_class_16_2_cc3ec6ef local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  anon_class_8_1_898e73a2 local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  anon_class_8_1_898e73a2 local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  anon_class_1_0_00000001 local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  anon_class_8_1_898e73a2 local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  *local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_198;
  undefined1 local_158 [24];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  commands;
  deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_> timers
  ;
  function<void_()> local_b8;
  t_loop local_98 [8];
  t_loop loop;
  function<void_()> local_38;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  suisha::t_loop::t_loop(local_98);
  std::function<void_()>::function(&local_b8,&local_38);
  std::function<void()>::operator=
            ((function<void()> *)&local_38,(anon_class_32_1_89933e73 *)&local_b8);
  main::$_0::~__0((__0 *)&local_b8);
  std::deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>::
  deque((deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
         *)&commands._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_3d9 = 1;
  local_2e0 = &local_2d8;
  s_abi_cxx11_(&local_300,"quit",4);
  local_308.loop = local_98;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_shin1m[P]suisha_examples_test_cc:20:13),_true>
            (&local_2d8,&local_300,&local_308);
  local_2e0 = &local_298;
  s_abi_cxx11_(&local_328,"echo",4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_shin1m[P]suisha_examples_test_cc:24:13),_true>
            (&local_298,&local_328,&local_329);
  local_2e0 = &local_258;
  s_abi_cxx11_(&local_350,"post",4);
  local_358.loop = local_98;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_shin1m[P]suisha_examples_test_cc:30:13),_true>
            (&local_258,&local_350,&local_358);
  local_2e0 = &local_218;
  s_abi_cxx11_(&local_378,"in",2);
  local_380.loop = local_98;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_shin1m[P]suisha_examples_test_cc:39:11),_true>
            (&local_218,&local_378,&local_380);
  local_2e0 = &local_1d8;
  s_abi_cxx11_(&local_3a0,"every",5);
  local_3b0.timers =
       (deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
        *)&commands._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_3b0.loop = local_98;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_shin1m[P]suisha_examples_test_cc:49:14),_true>
            (&local_1d8,&local_3a0,&local_3b0);
  local_2e0 = &local_198;
  s_abi_cxx11_(&local_3d0,"stop",4);
  local_3d8.timers =
       (deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
        *)&commands._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_shin1m[P]suisha_examples_test_cc:59:13),_true>
            (&local_198,&local_3d0,&local_3d8);
  local_3d9 = 0;
  local_158._0_8_ = &local_2d8;
  local_158._8_8_ = 6;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  ::allocator(&local_3db);
  __l._M_len = local_158._8_8_;
  __l._M_array = (iterator)local_158._0_8_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
         *)(local_158 + 0x10),__l,&local_3da,&local_3db);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  ::~allocator(&local_3db);
  local_470 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
               *)local_158;
  do {
    local_470 = local_470 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    ::~pair(local_470);
  } while (local_470 != &local_2d8);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_300);
  local_408.commands =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
        *)(local_158 + 0x10);
  std::function<void(bool,bool)>::function<main::__7,void>
            ((function<void(bool,bool)> *)&local_400,&local_408);
  suisha::t_loop::f_poll((int)local_98,false,true,(function *)0x0);
  std::function<void_(bool,_bool)>::~function(&local_400);
  suisha::t_loop::f_run();
  argv_local._4_4_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
          *)(local_158 + 0x10));
  std::deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>::
  ~deque((deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
          *)&commands._M_t._M_impl.super__Rb_tree_header._M_node_count);
  suisha::t_loop::~t_loop(local_98);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	t_loop loop;
	loop.v_wait = [wait = std::move(loop.v_wait)]
	{
		std::cout << "before wait"sv << std::endl;
		wait();
		std::cout << "after wait"sv << std::endl;
	};
	std::deque<std::shared_ptr<t_timer>> timers;
	std::map<std::string, std::function<void()>> commands = {
		{"quit"s, [&]
		{
			loop.f_exit();
		}},
		{"echo"s, []
		{
			std::string value;
			std::cin >> value;
			std::cout << value << std::endl;
		}},
		{"post"s, [&]
		{
			std::string value;
			std::cin >> value;
			loop.f_post([value]
			{
				std::cout << "posted: "sv << value << std::endl;
			});
		}},
		{"in"s, [&]
		{
			size_t interval;
			std::string value;
			std::cin >> interval >> value;
			loop.f_timer([value]
			{
				std::cout << "single: "sv << value << std::endl;
			}, std::chrono::milliseconds(interval), true);
		}},
		{"every"s, [&]
		{
			size_t interval;
			std::string value;
			std::cin >> interval >> value;
			timers.push_back(loop.f_timer([value]
			{
				std::cout << "repeat: "sv << value << std::endl;
			}, std::chrono::milliseconds(interval)));
		}},
		{"stop"s, [&]
		{
			timers.front()->f_stop();
			timers.pop_front();
		}}
	};
	try {
		loop.f_poll(0, true, false, [&](bool a_readable, bool a_writable)
		{
			if (!a_readable) return;
			std::string command;
			std::cin >> command;
			auto i = commands.find(command);
			if (i == commands.end())
				std::cerr << "unknown command: "sv << command << std::endl;
			else
				i->second();
		});
		loop.f_run();
		return EXIT_SUCCESS;
	} catch (std::exception& e) {
		std::cerr << "Error: "sv << e.what() << std::endl;
		return EXIT_FAILURE;
	}
}